

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

double __thiscall DataSet::biased(DataSet *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  reference pvVar1;
  double dVar2;
  Shape SVar3;
  uint uStack_4c;
  uint local_44;
  uint j;
  uint local_30;
  uint local_24;
  uint i;
  double bias;
  DataSet *this_local;
  
  dVar2 = min(this);
  this_local = (DataSet *)(1.0 - dVar2);
  if (1.0 <= (double)this_local) {
    local_24 = 0;
    while( true ) {
      SVar3 = Matrix<double>::shape(&this->m_matrix);
      local_30 = SVar3.n_row;
      if (local_30 <= local_24) break;
      local_44 = 0;
      while( true ) {
        SVar3 = Matrix<double>::shape(&this->m_matrix);
        uStack_4c = SVar3.n_col;
        if (uStack_4c - 1 <= local_44) break;
        this_00 = Matrix<double>::operator[](&this->m_matrix,local_24);
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)local_44);
        *pvVar1 = (double)this_local + *pvVar1;
        local_44 = local_44 + 1;
      }
      local_24 = local_24 + 1;
    }
  }
  else {
    this_local = (DataSet *)0x0;
  }
  return (double)this_local;
}

Assistant:

double DataSet::biased(){
    double bias=-1*min(*this)+1;

    if(bias<1) return 0.;

    for(unsigned i=0;i<m_matrix.shape().n_row;++i){
        for(unsigned j=0;j<m_matrix.shape().n_col-1;++j)
            m_matrix[i][j]+=bias;
    }
    return bias;
}